

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcache.h
# Opt level: O1

int __thiscall
QCache<QString,_QRegularExpression>::unlink(QCache<QString,_QRegularExpression> *this,char *__name)

{
  long lVar1;
  int extraout_EAX;
  size_t hash;
  QStringView QVar2;
  Bucket bucket;
  
  lVar1 = *(long *)__name;
  *(undefined8 *)(lVar1 + 8) = *(undefined8 *)(__name + 8);
  **(long **)(__name + 8) = lVar1;
  this->total = this->total - *(long *)(__name + 0x30);
  QVar2.m_data = *(storage_type **)(__name + 0x18);
  QVar2.m_size = *(qsizetype *)(__name + 0x20);
  hash = qHash(QVar2,(this->d).seed);
  bucket = QHashPrivate::Data<QCache<QString,_QRegularExpression>::Node>::
           findBucketWithHash<QString>(&this->d,(QString *)(__name + 0x10),hash);
  QHashPrivate::Data<QCache<QString,_QRegularExpression>::Node>::erase(&this->d,bucket);
  return extraout_EAX;
}

Assistant:

void unlink(Node *n) noexcept(std::is_nothrow_destructible_v<Node>)
    {
        Q_ASSERT(n->prev);
        Q_ASSERT(n->next);
        n->prev->next = n->next;
        n->next->prev = n->prev;
        total -= n->value.cost;
        auto it = d.findBucket(n->key);
        d.erase(it);
    }